

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

int32_t rcvbuf2q(NMQ *q)

{
  uint32_t uVar1;
  uint32_t uVar2;
  dlist_s *pdVar3;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  dlist_s *node;
  
  node = (q->rcv_buf).next;
  do {
    if (node == &q->rcv_buf) {
      return (int32_t)in_RAX;
    }
    pdVar3 = node->next;
    uVar1 = *(uint32_t *)&node[2].next;
    uVar2 = q->rcv_nxt;
    if (uVar1 == uVar2) {
      q->rcv_sn_to_node[(ulong)(q->MAX_RCV_BUF_NUM + uVar1) % (ulong)q->MAX_RCV_BUF_NUM] =
           (dlnode *)0x0;
      q->nrcv_que = q->nrcv_que + 1;
      q->nrcv_buf = q->nrcv_buf - 1;
      q->rcv_nxt = uVar2 + 1;
      dlist_remove_node(node);
      dlist_add_tail(&q->rcv_que,node);
      in_RAX = extraout_RAX;
    }
    node = pdVar3;
  } while (uVar1 == uVar2);
  return (int32_t)in_RAX;
}

Assistant:

static int32_t rcvbuf2q(NMQ *q) {
    int32_t tot = 0;
    dlnode *node = 0, *nxt = 0;
    FOR_EACH(node, nxt, &q->rcv_buf) {
        segment *s = ADDRESS_FOR(segment, head, node);
        if (s->sn == q->rcv_nxt) {
            q->rcv_sn_to_node[modsn(s->sn, q->MAX_RCV_BUF_NUM)] = NULL;
            segment *seg = ADDRESS_FOR(segment, head, node);
            q->nrcv_que++;
            q->nrcv_buf--;
            q->rcv_nxt++;
            dlist_remove_node(node);
            dlist_add_tail(&q->rcv_que, node);
            tot += seg->len;
        } else {
            break;
        }
    }
    return tot;
}